

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  long lVar6;
  long lVar7;
  PrimRefMB *pPVar8;
  undefined1 auVar9 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [12];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  uint uVar37;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  size_t itime;
  undefined4 uVar46;
  int iVar47;
  long lVar48;
  float fVar49;
  float fVar50;
  Vec3fa n1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar72;
  float fVar73;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar75;
  float fVar83;
  float fVar84;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar85;
  float fVar93;
  float fVar94;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  float fVar95;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar96;
  float fVar103;
  float fVar104;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar105;
  undefined1 auVar102 [32];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar119;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar113;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  float fVar118;
  undefined1 auVar116 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar127;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar123;
  float fVar125;
  float fVar126;
  undefined1 auVar124 [64];
  float fVar128;
  float fVar135;
  float fVar136;
  vfloat4 a0_1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  float fVar137;
  float fVar142;
  float fVar143;
  __m128 a;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar144;
  undefined1 auVar140 [16];
  float fVar145;
  undefined1 auVar141 [64];
  float fVar146;
  float fVar147;
  undefined1 auVar148 [32];
  float fVar152;
  float fVar154;
  undefined1 auVar149 [32];
  float fVar151;
  float fVar153;
  float fVar155;
  undefined1 auVar150 [64];
  Vec3fa n0;
  undefined1 auVar156 [16];
  float fVar159;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar163;
  float fVar164;
  undefined1 auVar162 [16];
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar167 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar176;
  float fVar177;
  vfloat4 a0;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  ulong local_320;
  unsigned_long local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_298;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_288;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_278;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  ulong local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  anon_class_16_2_07cfa4d6 local_1a8;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  undefined4 uStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar38;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar41 = r->_begin;
  if (uVar41 < r->_end) {
    local_258 = SUB6416(ZEXT464(0x3f800000),0);
    local_268 = ZEXT816(0x3f80000000000000);
    local_298.m128[2] = -INFINITY;
    local_298._0_8_ = 0xff800000ff800000;
    local_298.m128[3] = -INFINITY;
    auVar116 = ZEXT1664((undefined1  [16])local_298);
    local_2a8.m128[2] = INFINITY;
    local_2a8._0_8_ = 0x7f8000007f800000;
    local_2a8.m128[3] = INFINITY;
    auVar124 = ZEXT1664((undefined1  [16])local_2a8);
    local_2e0 = 0;
    auVar150 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar134 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar141 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    local_2d8 = 0;
    local_320 = 0;
    local_2d0 = k;
    local_288 = local_298;
    local_278 = local_2a8;
    do {
      auVar120 = auVar124._0_16_;
      auVar107 = auVar116._0_16_;
      auVar63 = auVar150._0_16_;
      BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar51._8_8_ = 0;
      auVar51._0_4_ = BVar3.lower;
      auVar51._4_4_ = BVar3.upper;
      auVar112 = vmovshdup_avx(auVar51);
      fVar49 = BVar3.lower;
      fVar50 = auVar112._0_4_ - fVar49;
      uVar37 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar41);
      uVar38 = (ulong)(uVar37 + 3);
      pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      auVar112 = _local_1e8;
      uVar36 = _local_1c8;
      if (uVar38 < (pBVar4->super_RawBufferView).num) {
        fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.fnumTimeSegments;
        auVar112 = ZEXT416((uint)(fVar2 * ((t0t1->lower - fVar49) / fVar50) * 1.0000002));
        auVar112 = vroundss_avx(auVar112,auVar112,9);
        auVar112 = vmaxss_avx(auVar63,auVar112);
        uVar39 = (uint)auVar112._0_4_;
        uVar40 = (ulong)uVar39;
        auVar112 = ZEXT416((uint)(fVar2 * ((t0t1->upper - fVar49) / fVar50) * 0.99999976));
        auVar112 = vroundss_avx(auVar112,auVar112,10);
        auVar108 = vminss_avx(auVar112,ZEXT416((uint)fVar2));
        if (uVar39 <= (uint)(int)auVar108._0_4_) {
          uVar40 = (ulong)(int)uVar39;
          pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.normals.items;
          fVar50 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.maxRadiusScale;
          _fStack_1e0 = bezier_basis0._1640_8_;
          local_1e8 = (undefined1  [8])bezier_basis0._1632_8_;
          auVar112 = _local_1e8;
          auVar20 = stack0xfffffffffffffe1c;
          _fStack_1d8 = bezier_basis0._1648_8_;
          uVar21 = _fStack_1d8;
          _fStack_1d0 = bezier_basis0._1656_8_;
          uVar22 = _fStack_1d0;
          local_208 = (float)bezier_basis0._2788_8_;
          fStack_204 = SUB84(bezier_basis0._2788_8_,4);
          fStack_200 = (float)bezier_basis0._2796_8_;
          fStack_1fc = SUB84(bezier_basis0._2796_8_,4);
          _fStack_1f8 = bezier_basis0._2804_8_;
          uVar18 = _fStack_1f8;
          _fStack_1f0 = bezier_basis0._2812_8_;
          uVar19 = _fStack_1f0;
          local_178 = (float)bezier_basis0._3944_8_;
          fStack_174 = SUB84(bezier_basis0._3944_8_,4);
          fStack_170 = (float)bezier_basis0._3952_8_;
          fStack_16c = SUB84(bezier_basis0._3952_8_,4);
          _fStack_168 = bezier_basis0._3960_8_;
          uVar30 = _fStack_168;
          _fStack_160 = bezier_basis0._3968_8_;
          uVar31 = _fStack_160;
          fVar49 = SUB84(bezier_basis0._5100_8_,4);
          _local_1c8 = bezier_basis0._5100_8_;
          uVar36 = _local_1c8;
          _fStack_1c0 = bezier_basis0._5108_8_;
          uVar23 = _fStack_1c0;
          _fStack_1b8 = bezier_basis0._5116_8_;
          uVar24 = _fStack_1b8;
          _fStack_1b0 = bezier_basis0._5124_8_;
          uVar25 = _fStack_1b0;
          _local_198 = bezier_basis0._6256_8_;
          uVar26 = _local_198;
          _fStack_190 = bezier_basis0._6264_8_;
          uVar27 = _fStack_190;
          _fStack_188 = bezier_basis0._6272_8_;
          uVar28 = _fStack_188;
          _fStack_180 = bezier_basis0._6280_8_;
          uVar29 = _fStack_180;
          local_b8 = (float)bezier_basis0._7412_8_;
          fStack_b4 = SUB84(bezier_basis0._7412_8_,4);
          fStack_b0 = (float)bezier_basis0._7420_8_;
          fStack_ac = SUB84(bezier_basis0._7420_8_,4);
          fStack_a8 = (float)bezier_basis0._7428_8_;
          fStack_a4 = SUB84(bezier_basis0._7428_8_,4);
          fStack_a0 = (float)bezier_basis0._7436_8_;
          uStack_9c = SUB84(bezier_basis0._7436_8_,4);
          _local_d8 = bezier_basis0._8568_8_;
          uVar32 = _local_d8;
          _fStack_d0 = bezier_basis0._8576_8_;
          uVar33 = _fStack_d0;
          _fStack_c8 = bezier_basis0._8584_8_;
          uVar34 = _fStack_c8;
          _fStack_c0 = bezier_basis0._8592_8_;
          uVar35 = _fStack_c0;
          lVar42 = uVar40 * 0x38 + 0x10;
          do {
            lVar6 = *(long *)((long)pBVar4 + lVar42 + -0x10);
            lVar7 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar42);
            lVar48 = lVar7 * (ulong)uVar37;
            lVar45 = lVar7 * (ulong)(uVar37 + 1);
            lVar44 = lVar7 * (ulong)(uVar37 + 2);
            auVar51 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar48)),
                                    ZEXT416(*(uint *)(lVar6 + 0xc + lVar45)),0x10);
            auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(lVar6 + 0xc + lVar44)),0x20);
            auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(lVar6 + 0xc + lVar7 * uVar38)),0x30);
            auVar63._8_4_ = 0x7fffffff;
            auVar63._0_8_ = 0x7fffffff7fffffff;
            auVar63._12_4_ = 0x7fffffff;
            auVar51 = vandps_avx(auVar51,auVar63);
            auVar63 = auVar134._0_16_;
            auVar51 = vcmpps_avx(auVar51,auVar63,5);
            _fStack_1f8 = uVar18;
            _fStack_1f0 = uVar19;
            _fStack_1d8 = uVar21;
            _fStack_1d0 = uVar22;
            _fStack_1c0 = uVar23;
            _fStack_1b8 = uVar24;
            _fStack_1b0 = uVar25;
            _local_198 = uVar26;
            _fStack_190 = uVar27;
            _fStack_188 = uVar28;
            _fStack_180 = uVar29;
            _fStack_168 = uVar30;
            _fStack_160 = uVar31;
            _local_d8 = uVar32;
            _fStack_d0 = uVar33;
            _fStack_c8 = uVar34;
            _fStack_c0 = uVar35;
            if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar51[0xf] < '\0') goto LAB_012468b8;
            auVar51 = *(undefined1 (*) [16])(lVar6 + lVar48);
            auVar53 = auVar141._0_16_;
            auVar52 = vcmpps_avx(auVar51,auVar53,6);
            auVar56 = vcmpps_avx(auVar51,auVar63,1);
            auVar52 = vandps_avx(auVar52,auVar56);
            uVar46 = vmovmskps_avx(auVar52);
            if ((~(byte)uVar46 & 7) != 0) goto LAB_012468b8;
            auVar52 = *(undefined1 (*) [16])(lVar6 + lVar45);
            auVar56 = vcmpps_avx(auVar52,auVar53,6);
            auVar54 = vcmpps_avx(auVar52,auVar63,1);
            auVar56 = vandps_avx(auVar56,auVar54);
            uVar46 = vmovmskps_avx(auVar56);
            if ((~(byte)uVar46 & 7) != 0) goto LAB_012468b8;
            auVar56 = *(undefined1 (*) [16])(lVar6 + lVar44);
            auVar54 = vcmpps_avx(auVar56,auVar53,6);
            auVar66 = vcmpps_avx(auVar56,auVar63,1);
            auVar54 = vandps_avx(auVar54,auVar66);
            uVar46 = vmovmskps_avx(auVar54);
            if ((~(byte)uVar46 & 7) != 0) goto LAB_012468b8;
            auVar54 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar38);
            auVar66 = vcmpps_avx(auVar54,auVar53,6);
            auVar64 = vcmpps_avx(auVar54,auVar63,1);
            auVar66 = vandps_avx(auVar66,auVar64);
            uVar46 = vmovmskps_avx(auVar66);
            if ((~(byte)uVar46 & 7) != 0) goto LAB_012468b8;
            lVar6 = *(long *)((long)pBVar5 + lVar42 + -0x10);
            lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar42);
            auVar66 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar37);
            auVar64 = vcmpps_avx(auVar66,auVar53,6);
            auVar55 = vcmpps_avx(auVar66,auVar63,1);
            auVar64 = vandps_avx(auVar64,auVar55);
            uVar46 = vmovmskps_avx(auVar64);
            if ((~(byte)uVar46 & 7) != 0) goto LAB_012468b8;
            auVar64 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)(uVar37 + 1));
            auVar53 = vcmpps_avx(auVar64,auVar53,6);
            auVar63 = vcmpps_avx(auVar64,auVar63,1);
            auVar63 = vandps_avx(auVar53,auVar63);
            uVar46 = vmovmskps_avx(auVar63);
            if ((~(byte)uVar46 & 7) != 0) goto LAB_012468b8;
            auVar63 = vshufps_avx(auVar51,auVar51,0xff);
            auVar51 = vinsertps_avx(auVar51,ZEXT416((uint)(auVar63._0_4_ * fVar50)),0x30);
            auVar63 = vshufps_avx(auVar52,auVar52,0xff);
            auVar63 = vinsertps_avx(auVar52,ZEXT416((uint)(auVar63._0_4_ * fVar50)),0x30);
            auVar52 = vshufps_avx(auVar56,auVar56,0xff);
            auVar52 = vinsertps_avx(auVar56,ZEXT416((uint)(auVar52._0_4_ * fVar50)),0x30);
            auVar56 = vshufps_avx(auVar54,auVar54,0xff);
            auVar56 = vinsertps_avx(auVar54,ZEXT416((uint)(auVar56._0_4_ * fVar50)),0x30);
            pfVar1 = (float *)(lVar6 + lVar7 * (ulong)(uVar37 + 2));
            fVar95 = *pfVar1;
            fVar75 = pfVar1[1];
            fVar83 = pfVar1[2];
            fVar84 = pfVar1[3];
            pfVar1 = (float *)(lVar6 + lVar7 * uVar38);
            fVar85 = *pfVar1;
            fVar93 = pfVar1[1];
            fVar94 = pfVar1[2];
            fVar159 = pfVar1[3];
            fVar96 = auVar56._0_4_;
            fVar103 = auVar56._4_4_;
            fVar104 = auVar56._8_4_;
            fVar105 = auVar56._12_4_;
            fVar106 = auVar52._0_4_;
            fVar117 = auVar52._4_4_;
            fVar118 = auVar52._8_4_;
            fVar119 = auVar52._12_4_;
            fVar62 = auVar63._0_4_;
            fVar72 = auVar63._4_4_;
            fVar73 = auVar63._8_4_;
            fVar74 = auVar63._12_4_;
            auVar138._0_4_ = fVar62 * 0.0 + fVar106 * 0.5 + fVar96 * 0.0;
            auVar138._4_4_ = fVar72 * 0.0 + fVar117 * 0.5 + fVar103 * 0.0;
            auVar138._8_4_ = fVar73 * 0.0 + fVar118 * 0.5 + fVar104 * 0.0;
            auVar138._12_4_ = fVar74 * 0.0 + fVar119 * 0.5 + fVar105 * 0.0;
            fVar128 = auVar51._0_4_;
            auVar162._0_4_ = fVar128 * 0.5;
            fVar135 = auVar51._4_4_;
            auVar162._4_4_ = fVar135 * 0.5;
            fVar136 = auVar51._8_4_;
            auVar162._8_4_ = fVar136 * 0.5;
            fVar137 = auVar51._12_4_;
            auVar162._12_4_ = fVar137 * 0.5;
            auVar68 = vsubps_avx(auVar138,auVar162);
            fVar146 = auVar64._0_4_;
            fVar151 = auVar64._4_4_;
            fVar153 = auVar64._8_4_;
            fVar155 = auVar64._12_4_;
            auVar139._0_4_ = fVar95 * 0.5 + fVar85 * 0.0 + fVar146 * 0.0;
            auVar139._4_4_ = fVar75 * 0.5 + fVar93 * 0.0 + fVar151 * 0.0;
            auVar139._8_4_ = fVar83 * 0.5 + fVar94 * 0.0 + fVar153 * 0.0;
            auVar139._12_4_ = fVar84 * 0.5 + fVar159 * 0.0 + fVar155 * 0.0;
            fVar145 = auVar66._0_4_;
            auVar173._0_4_ = fVar145 * 0.5;
            fVar125 = auVar66._4_4_;
            auVar173._4_4_ = fVar125 * 0.5;
            fVar126 = auVar66._8_4_;
            auVar173._8_4_ = fVar126 * 0.5;
            fVar127 = auVar66._12_4_;
            auVar173._12_4_ = fVar127 * 0.5;
            auVar56 = vsubps_avx(auVar139,auVar173);
            local_358._0_4_ = fVar128 * -0.0 + fVar96 * -0.0 + fVar106 * 0.0 + fVar62;
            local_358._4_4_ = fVar135 * -0.0 + fVar103 * -0.0 + fVar117 * 0.0 + fVar72;
            fStack_350 = fVar136 * -0.0 + fVar104 * -0.0 + fVar118 * 0.0 + fVar73;
            fStack_34c = fVar137 * -0.0 + fVar105 * -0.0 + fVar119 * 0.0 + fVar74;
            auVar122._0_4_ = fVar128 * -0.0 + fVar62 * 0.0 + fVar96 * -0.0 + fVar106;
            auVar122._4_4_ = fVar135 * -0.0 + fVar72 * 0.0 + fVar103 * -0.0 + fVar117;
            auVar122._8_4_ = fVar136 * -0.0 + fVar73 * 0.0 + fVar104 * -0.0 + fVar118;
            auVar122._12_4_ = fVar137 * -0.0 + fVar74 * 0.0 + fVar105 * -0.0 + fVar119;
            auVar109._0_4_ = fVar106 * 0.0 + fVar96 * 0.5;
            auVar109._4_4_ = fVar117 * 0.0 + fVar103 * 0.5;
            auVar109._8_4_ = fVar118 * 0.0 + fVar104 * 0.5;
            auVar109._12_4_ = fVar119 * 0.0 + fVar105 * 0.5;
            auVar174._0_4_ = fVar95 * 0.0 + fVar85 * -0.0 + fVar146 + fVar145 * -0.0;
            auVar174._4_4_ = fVar75 * 0.0 + fVar93 * -0.0 + fVar151 + fVar125 * -0.0;
            auVar174._8_4_ = fVar83 * 0.0 + fVar94 * -0.0 + fVar153 + fVar126 * -0.0;
            auVar174._12_4_ = fVar84 * 0.0 + fVar159 * -0.0 + fVar155 + fVar127 * -0.0;
            auVar86._0_4_ = fVar62 * 0.5;
            auVar86._4_4_ = fVar72 * 0.5;
            auVar86._8_4_ = fVar73 * 0.5;
            auVar86._12_4_ = fVar74 * 0.5;
            auVar51 = vsubps_avx(auVar109,auVar86);
            auVar110._0_4_ = fVar128 * 0.0 + auVar51._0_4_;
            auVar110._4_4_ = fVar135 * 0.0 + auVar51._4_4_;
            auVar110._8_4_ = fVar136 * 0.0 + auVar51._8_4_;
            auVar110._12_4_ = fVar137 * 0.0 + auVar51._12_4_;
            auVar66._0_4_ = fVar145 * -0.0 + fVar95 + fVar85 * -0.0 + fVar146 * 0.0;
            auVar66._4_4_ = fVar125 * -0.0 + fVar75 + fVar93 * -0.0 + fVar151 * 0.0;
            auVar66._8_4_ = fVar126 * -0.0 + fVar83 + fVar94 * -0.0 + fVar153 * 0.0;
            auVar66._12_4_ = fVar127 * -0.0 + fVar84 + fVar159 * -0.0 + fVar155 * 0.0;
            auVar76._0_4_ = fVar95 * 0.0 + fVar85 * 0.5;
            auVar76._4_4_ = fVar75 * 0.0 + fVar93 * 0.5;
            auVar76._8_4_ = fVar83 * 0.0 + fVar94 * 0.5;
            auVar76._12_4_ = fVar84 * 0.0 + fVar159 * 0.5;
            auVar52._0_4_ = fVar146 * 0.5;
            auVar52._4_4_ = fVar151 * 0.5;
            auVar52._8_4_ = fVar153 * 0.5;
            auVar52._12_4_ = fVar155 * 0.5;
            auVar51 = vsubps_avx(auVar76,auVar52);
            auVar77._0_4_ = fVar145 * 0.0 + auVar51._0_4_;
            auVar77._4_4_ = fVar125 * 0.0 + auVar51._4_4_;
            auVar77._8_4_ = fVar126 * 0.0 + auVar51._8_4_;
            auVar77._12_4_ = fVar127 * 0.0 + auVar51._12_4_;
            auVar51 = vshufps_avx(auVar68,auVar68,0xc9);
            auVar63 = vshufps_avx(auVar174,auVar174,0xc9);
            fVar147 = auVar68._0_4_;
            auVar87._0_4_ = fVar147 * auVar63._0_4_;
            fVar154 = auVar68._4_4_;
            auVar87._4_4_ = fVar154 * auVar63._4_4_;
            fVar163 = auVar68._8_4_;
            auVar87._8_4_ = fVar163 * auVar63._8_4_;
            fVar165 = auVar68._12_4_;
            auVar87._12_4_ = fVar165 * auVar63._12_4_;
            auVar97._0_4_ = auVar174._0_4_ * auVar51._0_4_;
            auVar97._4_4_ = auVar174._4_4_ * auVar51._4_4_;
            auVar97._8_4_ = auVar174._8_4_ * auVar51._8_4_;
            auVar97._12_4_ = auVar174._12_4_ * auVar51._12_4_;
            auVar63 = vsubps_avx(auVar97,auVar87);
            auVar52 = vshufps_avx(auVar63,auVar63,0xc9);
            auVar63 = vshufps_avx(auVar56,auVar56,0xc9);
            auVar98._0_4_ = fVar147 * auVar63._0_4_;
            auVar98._4_4_ = fVar154 * auVar63._4_4_;
            auVar98._8_4_ = fVar163 * auVar63._8_4_;
            auVar98._12_4_ = fVar165 * auVar63._12_4_;
            auVar53._0_4_ = auVar56._0_4_ * auVar51._0_4_;
            auVar53._4_4_ = auVar56._4_4_ * auVar51._4_4_;
            auVar53._8_4_ = auVar56._8_4_ * auVar51._8_4_;
            auVar53._12_4_ = auVar56._12_4_ * auVar51._12_4_;
            auVar51 = vsubps_avx(auVar53,auVar98);
            auVar56 = vshufps_avx(auVar51,auVar51,0xc9);
            auVar51 = vshufps_avx(auVar110,auVar110,0xc9);
            auVar63 = vshufps_avx(auVar66,auVar66,0xc9);
            auVar54._0_4_ = auVar110._0_4_ * auVar63._0_4_;
            auVar54._4_4_ = auVar110._4_4_ * auVar63._4_4_;
            auVar54._8_4_ = auVar110._8_4_ * auVar63._8_4_;
            auVar54._12_4_ = auVar110._12_4_ * auVar63._12_4_;
            auVar64._0_4_ = auVar66._0_4_ * auVar51._0_4_;
            auVar64._4_4_ = auVar66._4_4_ * auVar51._4_4_;
            auVar64._8_4_ = auVar66._8_4_ * auVar51._8_4_;
            auVar64._12_4_ = auVar66._12_4_ * auVar51._12_4_;
            auVar63 = vsubps_avx(auVar64,auVar54);
            auVar53 = vshufps_avx(auVar63,auVar63,0xc9);
            auVar63 = vshufps_avx(auVar77,auVar77,0xc9);
            auVar65._0_4_ = auVar110._0_4_ * auVar63._0_4_;
            auVar65._4_4_ = auVar110._4_4_ * auVar63._4_4_;
            auVar65._8_4_ = auVar110._8_4_ * auVar63._8_4_;
            auVar65._12_4_ = auVar110._12_4_ * auVar63._12_4_;
            auVar78._0_4_ = auVar77._0_4_ * auVar51._0_4_;
            auVar78._4_4_ = auVar77._4_4_ * auVar51._4_4_;
            auVar78._8_4_ = auVar77._8_4_ * auVar51._8_4_;
            auVar78._12_4_ = auVar77._12_4_ * auVar51._12_4_;
            auVar51 = vsubps_avx(auVar78,auVar65);
            auVar54 = vshufps_avx(auVar51,auVar51,0xc9);
            auVar51 = vdpps_avx(auVar52,auVar52,0x7f);
            fVar146 = auVar51._0_4_;
            auVar64 = ZEXT416((uint)fVar146);
            auVar63 = vrsqrtss_avx(auVar64,auVar64);
            fVar62 = auVar63._0_4_;
            auVar63 = vdpps_avx(auVar52,auVar56,0x7f);
            auVar66 = ZEXT416((uint)(fVar62 * 1.5 - fVar146 * 0.5 * fVar62 * fVar62 * fVar62));
            auVar66 = vshufps_avx(auVar66,auVar66,0);
            fVar62 = auVar66._0_4_ * auVar52._0_4_;
            fVar72 = auVar66._4_4_ * auVar52._4_4_;
            fVar73 = auVar66._8_4_ * auVar52._8_4_;
            fVar74 = auVar66._12_4_ * auVar52._12_4_;
            auVar51 = vshufps_avx(auVar51,auVar51,0);
            auVar99._0_4_ = auVar51._0_4_ * auVar56._0_4_;
            auVar99._4_4_ = auVar51._4_4_ * auVar56._4_4_;
            auVar99._8_4_ = auVar51._8_4_ * auVar56._8_4_;
            auVar99._12_4_ = auVar51._12_4_ * auVar56._12_4_;
            auVar51 = vshufps_avx(auVar63,auVar63,0);
            auVar88._0_4_ = auVar51._0_4_ * auVar52._0_4_;
            auVar88._4_4_ = auVar51._4_4_ * auVar52._4_4_;
            auVar88._8_4_ = auVar51._8_4_ * auVar52._8_4_;
            auVar88._12_4_ = auVar51._12_4_ * auVar52._12_4_;
            auVar65 = vsubps_avx(auVar99,auVar88);
            auVar51 = vrcpss_avx(auVar64,auVar64);
            auVar51 = ZEXT416((uint)(auVar51._0_4_ * (2.0 - fVar146 * auVar51._0_4_)));
            auVar56 = vshufps_avx(auVar51,auVar51,0);
            auVar63 = vdpps_avx(auVar53,auVar53,0x7f);
            auVar51 = vblendps_avx(auVar63,_DAT_01f7aa10,0xe);
            auVar52 = vrsqrtss_avx(auVar51,auVar51);
            fVar146 = auVar52._0_4_;
            auVar52 = ZEXT416((uint)(fVar146 * 1.5 -
                                    auVar63._0_4_ * 0.5 * fVar146 * fVar146 * fVar146));
            auVar64 = vshufps_avx(auVar52,auVar52,0);
            fVar146 = auVar64._0_4_ * auVar53._0_4_;
            fVar151 = auVar64._4_4_ * auVar53._4_4_;
            fVar153 = auVar64._8_4_ * auVar53._8_4_;
            fVar155 = auVar64._12_4_ * auVar53._12_4_;
            auVar52 = vdpps_avx(auVar53,auVar54,0x7f);
            auVar55 = vshufps_avx(auVar63,auVar63,0);
            auVar79._0_4_ = auVar55._0_4_ * auVar54._0_4_;
            auVar79._4_4_ = auVar55._4_4_ * auVar54._4_4_;
            auVar79._8_4_ = auVar55._8_4_ * auVar54._8_4_;
            auVar79._12_4_ = auVar55._12_4_ * auVar54._12_4_;
            auVar52 = vshufps_avx(auVar52,auVar52,0);
            auVar55._0_4_ = auVar52._0_4_ * auVar53._0_4_;
            auVar55._4_4_ = auVar52._4_4_ * auVar53._4_4_;
            auVar55._8_4_ = auVar52._8_4_ * auVar53._8_4_;
            auVar55._12_4_ = auVar52._12_4_ * auVar53._12_4_;
            auVar53 = vsubps_avx(auVar79,auVar55);
            auVar51 = vrcpss_avx(auVar51,auVar51);
            auVar51 = ZEXT416((uint)(auVar51._0_4_ * (2.0 - auVar63._0_4_ * auVar51._0_4_)));
            auVar51 = vshufps_avx(auVar51,auVar51,0);
            auVar63 = vshufps_avx(_local_358,_local_358,0xff);
            auVar130._0_4_ = auVar63._0_4_ * fVar62;
            auVar130._4_4_ = auVar63._4_4_ * fVar72;
            auVar130._8_4_ = auVar63._8_4_ * fVar73;
            auVar130._12_4_ = auVar63._12_4_ * fVar74;
            auVar55 = vsubps_avx(_local_358,auVar130);
            auVar52 = vshufps_avx(auVar68,auVar68,0xff);
            auVar67._0_4_ =
                 auVar52._0_4_ * fVar62 +
                 auVar63._0_4_ * auVar66._0_4_ * auVar65._0_4_ * auVar56._0_4_;
            auVar67._4_4_ =
                 auVar52._4_4_ * fVar72 +
                 auVar63._4_4_ * auVar66._4_4_ * auVar65._4_4_ * auVar56._4_4_;
            auVar67._8_4_ =
                 auVar52._8_4_ * fVar73 +
                 auVar63._8_4_ * auVar66._8_4_ * auVar65._8_4_ * auVar56._8_4_;
            auVar67._12_4_ =
                 auVar52._12_4_ * fVar74 +
                 auVar63._12_4_ * auVar66._12_4_ * auVar65._12_4_ * auVar56._12_4_;
            auVar56 = vsubps_avx(auVar68,auVar67);
            local_358._0_4_ = (float)local_358._0_4_ + auVar130._0_4_;
            local_358._4_4_ = (float)local_358._4_4_ + auVar130._4_4_;
            fStack_350 = fStack_350 + auVar130._8_4_;
            fStack_34c = fStack_34c + auVar130._12_4_;
            auVar63 = vshufps_avx(auVar122,auVar122,0xff);
            auVar131._0_4_ = fVar146 * auVar63._0_4_;
            auVar131._4_4_ = fVar151 * auVar63._4_4_;
            auVar131._8_4_ = fVar153 * auVar63._8_4_;
            auVar131._12_4_ = fVar155 * auVar63._12_4_;
            auVar54 = vsubps_avx(auVar122,auVar131);
            auVar52 = vshufps_avx(auVar110,auVar110,0xff);
            auVar68._0_4_ =
                 auVar52._0_4_ * fVar146 +
                 auVar63._0_4_ * auVar64._0_4_ * auVar53._0_4_ * auVar51._0_4_;
            auVar68._4_4_ =
                 auVar52._4_4_ * fVar151 +
                 auVar63._4_4_ * auVar64._4_4_ * auVar53._4_4_ * auVar51._4_4_;
            auVar68._8_4_ =
                 auVar52._8_4_ * fVar153 +
                 auVar63._8_4_ * auVar64._8_4_ * auVar53._8_4_ * auVar51._8_4_;
            auVar68._12_4_ =
                 auVar52._12_4_ * fVar155 +
                 auVar63._12_4_ * auVar64._12_4_ * auVar53._12_4_ * auVar51._12_4_;
            auVar51 = vsubps_avx(auVar110,auVar68);
            local_338._4_4_ = auVar122._4_4_ + auVar131._4_4_;
            local_338._0_4_ = auVar122._0_4_ + auVar131._0_4_;
            fStack_330 = auVar122._8_4_ + auVar131._8_4_;
            fStack_32c = auVar122._12_4_ + auVar131._12_4_;
            auVar69._0_4_ = auVar55._0_4_ + auVar56._0_4_ * 0.33333334;
            auVar69._4_4_ = auVar55._4_4_ + auVar56._4_4_ * 0.33333334;
            auVar69._8_4_ = auVar55._8_4_ + auVar56._8_4_ * 0.33333334;
            auVar69._12_4_ = auVar55._12_4_ + auVar56._12_4_ * 0.33333334;
            auVar89._0_4_ = auVar51._0_4_ * 0.33333334;
            auVar89._4_4_ = auVar51._4_4_ * 0.33333334;
            auVar89._8_4_ = auVar51._8_4_ * 0.33333334;
            auVar89._12_4_ = auVar51._12_4_ * 0.33333334;
            auVar52 = vsubps_avx(auVar54,auVar89);
            auVar51 = vshufps_avx(auVar52,auVar52,0);
            auVar63 = vshufps_avx(auVar52,auVar52,0x55);
            auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
            auVar56 = vshufps_avx(auVar54,auVar54,0);
            auVar53 = vshufps_avx(auVar54,auVar54,0x55);
            auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
            fStack_168 = (float)bezier_basis0._3960_8_;
            fStack_164 = SUB84(bezier_basis0._3960_8_,4);
            fStack_160 = (float)bezier_basis0._3968_8_;
            fVar106 = auVar56._0_4_;
            fVar117 = auVar56._4_4_;
            fVar118 = auVar56._8_4_;
            fVar119 = auVar56._12_4_;
            fVar84 = auVar53._0_4_;
            fVar85 = auVar53._4_4_;
            fVar93 = auVar53._8_4_;
            fVar94 = auVar53._12_4_;
            fVar96 = auVar54._0_4_;
            fVar103 = auVar54._4_4_;
            fVar104 = auVar54._8_4_;
            fVar105 = auVar54._12_4_;
            fStack_1f8 = (float)bezier_basis0._2804_8_;
            fStack_1f4 = SUB84(bezier_basis0._2804_8_,4);
            fStack_1f0 = (float)bezier_basis0._2812_8_;
            fVar128 = auVar51._0_4_;
            fVar135 = auVar51._4_4_;
            fVar136 = auVar51._8_4_;
            fVar137 = auVar51._12_4_;
            fVar62 = auVar63._0_4_;
            fVar73 = auVar63._4_4_;
            fVar146 = auVar63._8_4_;
            fVar155 = auVar52._0_4_;
            fVar95 = auVar52._4_4_;
            fVar75 = auVar52._8_4_;
            fVar83 = auVar52._12_4_;
            auVar51 = vshufps_avx(auVar69,auVar69,0);
            local_1e8._0_4_ = (undefined4)bezier_basis0._1632_8_;
            local_1e8._4_4_ = SUB84(bezier_basis0._1632_8_,4);
            fStack_1e0 = (float)bezier_basis0._1640_8_;
            fStack_1dc = SUB84(bezier_basis0._1640_8_,4);
            fStack_1d8 = (float)bezier_basis0._1648_8_;
            fStack_1d4 = SUB84(bezier_basis0._1648_8_,4);
            fStack_1d0 = (float)bezier_basis0._1656_8_;
            fVar172 = auVar51._0_4_;
            fVar176 = auVar51._4_4_;
            fVar177 = auVar51._8_4_;
            auVar52 = vshufps_avx(auVar69,auVar69,0x55);
            fVar166 = auVar52._0_4_;
            fVar168 = auVar52._4_4_;
            fVar169 = auVar52._8_4_;
            auVar56 = vshufps_avx(auVar69,auVar69,0xaa);
            fVar152 = auVar56._0_4_;
            fVar161 = auVar56._4_4_;
            fVar164 = auVar56._8_4_;
            fVar159 = fVar137 + 0.0 + 0.0;
            auVar53 = vshufps_avx(auVar55,auVar55,0);
            local_2c8 = (float)bezier_basis0._476_8_;
            fStack_2c4 = SUB84(bezier_basis0._476_8_,4);
            fStack_2c0 = (float)bezier_basis0._484_8_;
            fStack_2bc = SUB84(bezier_basis0._484_8_,4);
            fStack_2b8 = (float)bezier_basis0._492_8_;
            fStack_2b4 = SUB84(bezier_basis0._492_8_,4);
            fStack_2b0 = (float)bezier_basis0._500_8_;
            fVar72 = auVar53._0_4_;
            fVar74 = auVar53._4_4_;
            fVar151 = auVar53._8_4_;
            fVar153 = auVar53._12_4_;
            auVar170._0_4_ =
                 fVar72 * local_2c8 +
                 fVar172 * (float)local_1e8._0_4_ + fVar128 * local_208 + fVar106 * local_178;
            auVar170._4_4_ =
                 fVar74 * fStack_2c4 +
                 fVar176 * (float)local_1e8._4_4_ + fVar135 * fStack_204 + fVar117 * fStack_174;
            auVar170._8_4_ =
                 fVar151 * fStack_2c0 +
                 fVar177 * fStack_1e0 + fVar136 * fStack_200 + fVar118 * fStack_170;
            auVar170._12_4_ =
                 fVar153 * fStack_2bc +
                 auVar51._12_4_ * fStack_1dc + fVar137 * fStack_1fc + fVar119 * fStack_16c;
            auVar170._16_4_ =
                 fVar72 * fStack_2b8 +
                 fVar172 * fStack_1d8 + fVar128 * fStack_1f8 + fVar106 * fStack_168;
            auVar170._20_4_ =
                 fVar74 * fStack_2b4 +
                 fVar176 * fStack_1d4 + fVar135 * fStack_1f4 + fVar117 * fStack_164;
            auVar170._24_4_ =
                 fVar151 * fStack_2b0 +
                 fVar177 * fStack_1d0 + fVar136 * fStack_1f0 + fVar118 * fStack_160;
            auVar170._28_4_ = fVar137 + 0.0 + 0.0 + 0.0;
            auVar53 = vshufps_avx(auVar55,auVar55,0x55);
            fVar125 = auVar53._0_4_;
            fVar126 = auVar53._4_4_;
            fVar127 = auVar53._8_4_;
            auVar80._0_4_ =
                 fVar125 * local_2c8 +
                 fVar166 * (float)local_1e8._0_4_ + fVar62 * local_208 + fVar84 * local_178;
            auVar80._4_4_ =
                 fVar126 * fStack_2c4 +
                 fVar168 * (float)local_1e8._4_4_ + fVar73 * fStack_204 + fVar85 * fStack_174;
            auVar80._8_4_ =
                 fVar127 * fStack_2c0 +
                 fVar169 * fStack_1e0 + fVar146 * fStack_200 + fVar93 * fStack_170;
            auVar80._12_4_ =
                 auVar53._12_4_ * fStack_2bc +
                 auVar52._12_4_ * fStack_1dc + auVar63._12_4_ * fStack_1fc + fVar94 * fStack_16c;
            auVar80._16_4_ =
                 fVar125 * fStack_2b8 +
                 fVar166 * fStack_1d8 + fVar62 * fStack_1f8 + fVar84 * fStack_168;
            auVar80._20_4_ =
                 fVar126 * fStack_2b4 +
                 fVar168 * fStack_1d4 + fVar73 * fStack_1f4 + fVar85 * fStack_164;
            auVar80._24_4_ =
                 fVar127 * fStack_2b0 +
                 fVar169 * fStack_1d0 + fVar146 * fStack_1f0 + fVar93 * fStack_160;
            auVar80._28_4_ = fVar137 + 0.0 + 0.0 + 0.0;
            auVar54 = vshufps_avx(auVar55,auVar55,0xaa);
            fVar142 = auVar54._0_4_;
            fVar143 = auVar54._4_4_;
            fVar144 = auVar54._8_4_;
            auVar90._0_4_ =
                 fVar155 * local_208 + fVar96 * local_178 + fVar152 * (float)local_1e8._0_4_ +
                 fVar142 * local_2c8;
            auVar90._4_4_ =
                 fVar95 * fStack_204 + fVar103 * fStack_174 + fVar161 * (float)local_1e8._4_4_ +
                 fVar143 * fStack_2c4;
            auVar90._8_4_ =
                 fVar75 * fStack_200 + fVar104 * fStack_170 + fVar164 * fStack_1e0 +
                 fVar144 * fStack_2c0;
            auVar90._12_4_ =
                 fVar83 * fStack_1fc + fVar105 * fStack_16c + auVar56._12_4_ * fStack_1dc +
                 auVar54._12_4_ * fStack_2bc;
            auVar90._16_4_ =
                 fVar155 * fStack_1f8 + fVar96 * fStack_168 + fVar152 * fStack_1d8 +
                 fVar142 * fStack_2b8;
            auVar90._20_4_ =
                 fVar95 * fStack_1f4 + fVar103 * fStack_164 + fVar161 * fStack_1d4 +
                 fVar143 * fStack_2b4;
            auVar90._24_4_ =
                 fVar75 * fStack_1f0 + fVar104 * fStack_160 + fVar164 * fStack_1d0 +
                 fVar144 * fStack_2b0;
            auVar90._28_4_ = fVar159 + 0.0;
            local_d8 = (float)bezier_basis0._8568_8_;
            fStack_d4 = SUB84(bezier_basis0._8568_8_,4);
            fStack_d0 = (float)bezier_basis0._8576_8_;
            fStack_cc = SUB84(bezier_basis0._8576_8_,4);
            fStack_c8 = (float)bezier_basis0._8584_8_;
            fStack_c4 = SUB84(bezier_basis0._8584_8_,4);
            fStack_c0 = (float)bezier_basis0._8592_8_;
            fVar145 = fVar159 + fVar119;
            local_198 = (float)bezier_basis0._6256_8_;
            fStack_194 = SUB84(bezier_basis0._6256_8_,4);
            fStack_190 = (float)bezier_basis0._6264_8_;
            fStack_18c = SUB84(bezier_basis0._6264_8_,4);
            fStack_188 = (float)bezier_basis0._6272_8_;
            fStack_184 = SUB84(bezier_basis0._6272_8_,4);
            fStack_180 = (float)bezier_basis0._6280_8_;
            fStack_17c = SUB84(bezier_basis0._6280_8_,4);
            fVar159 = fVar145 + fVar159 + fVar94;
            local_1c8 = (float)bezier_basis0._5100_8_;
            fStack_1c0 = (float)bezier_basis0._5108_8_;
            fStack_1bc = SUB84(bezier_basis0._5108_8_,4);
            fStack_1b8 = (float)bezier_basis0._5116_8_;
            fStack_1b4 = SUB84(bezier_basis0._5116_8_,4);
            fStack_1b0 = (float)bezier_basis0._5124_8_;
            auVar100._0_4_ =
                 fVar72 * local_1c8 + local_b8 * fVar128 + fVar106 * local_d8 + fVar172 * local_198;
            auVar100._4_4_ =
                 fVar74 * fVar49 + fStack_b4 * fVar135 + fVar117 * fStack_d4 + fVar176 * fStack_194;
            auVar100._8_4_ =
                 fVar151 * fStack_1c0 +
                 fStack_b0 * fVar136 + fVar118 * fStack_d0 + fVar177 * fStack_190;
            auVar100._12_4_ =
                 fVar153 * fStack_1bc +
                 fStack_ac * fVar137 + fVar119 * fStack_cc + auVar51._12_4_ * fStack_18c;
            auVar100._16_4_ =
                 fVar72 * fStack_1b8 +
                 fStack_a8 * fVar128 + fVar106 * fStack_c8 + fVar172 * fStack_188;
            auVar100._20_4_ =
                 fVar74 * fStack_1b4 +
                 fStack_a4 * fVar135 + fVar117 * fStack_c4 + fVar176 * fStack_184;
            auVar100._24_4_ =
                 fVar151 * fStack_1b0 +
                 fStack_a0 * fVar136 + fVar118 * fStack_c0 + fVar177 * fStack_180;
            auVar100._28_4_ = fVar153 + fVar145 + fVar105;
            auVar59._0_4_ =
                 fVar125 * local_1c8 + fVar166 * local_198 + local_b8 * fVar62 + fVar84 * local_d8;
            auVar59._4_4_ =
                 fVar126 * fVar49 + fVar168 * fStack_194 + fStack_b4 * fVar73 + fVar85 * fStack_d4;
            auVar59._8_4_ =
                 fVar127 * fStack_1c0 +
                 fVar169 * fStack_190 + fStack_b0 * fVar146 + fVar93 * fStack_d0;
            auVar59._12_4_ =
                 auVar53._12_4_ * fStack_1bc +
                 auVar52._12_4_ * fStack_18c + fStack_ac * auVar63._12_4_ + fVar94 * fStack_cc;
            auVar59._16_4_ =
                 fVar125 * fStack_1b8 +
                 fVar166 * fStack_188 + fStack_a8 * fVar62 + fVar84 * fStack_c8;
            auVar59._20_4_ =
                 fVar126 * fStack_1b4 +
                 fVar168 * fStack_184 + fStack_a4 * fVar73 + fVar85 * fStack_c4;
            auVar59._24_4_ =
                 fVar127 * fStack_1b0 +
                 fVar169 * fStack_180 + fStack_a0 * fVar146 + fVar93 * fStack_c0;
            auVar59._28_4_ = fStack_17c + fVar159;
            auVar114._0_4_ =
                 fVar142 * local_1c8 + fVar152 * local_198 + fVar155 * local_b8 + fVar96 * local_d8;
            auVar114._4_4_ =
                 fVar143 * fVar49 + fVar161 * fStack_194 + fVar95 * fStack_b4 + fVar103 * fStack_d4;
            auVar114._8_4_ =
                 fVar144 * fStack_1c0 +
                 fVar164 * fStack_190 + fVar75 * fStack_b0 + fVar104 * fStack_d0;
            auVar114._12_4_ =
                 auVar54._12_4_ * fStack_1bc +
                 auVar56._12_4_ * fStack_18c + fVar83 * fStack_ac + fVar105 * fStack_cc;
            auVar114._16_4_ =
                 fVar142 * fStack_1b8 +
                 fVar152 * fStack_188 + fVar155 * fStack_a8 + fVar96 * fStack_c8;
            auVar114._20_4_ =
                 fVar143 * fStack_1b4 +
                 fVar161 * fStack_184 + fVar95 * fStack_a4 + fVar103 * fStack_c4;
            auVar114._24_4_ =
                 fVar144 * fStack_1b0 +
                 fVar164 * fStack_180 + fVar75 * fStack_a0 + fVar104 * fStack_c0;
            auVar114._28_4_ = fVar159 + fVar145 + fVar83 + fVar105;
            auVar157 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar9 = vblendps_avx(auVar100,auVar157,1);
            auVar157 = vblendps_avx(auVar59,auVar157,1);
            auVar158 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar149 = vblendps_avx(auVar114,auVar158,1);
            auVar133._4_4_ = auVar9._4_4_ * 0.055555556;
            auVar133._0_4_ = auVar9._0_4_ * 0.055555556;
            auVar133._8_4_ = auVar9._8_4_ * 0.055555556;
            auVar133._12_4_ = auVar9._12_4_ * 0.055555556;
            auVar133._16_4_ = auVar9._16_4_ * 0.055555556;
            auVar133._20_4_ = auVar9._20_4_ * 0.055555556;
            auVar133._24_4_ = auVar9._24_4_ * 0.055555556;
            auVar133._28_4_ = auVar9._28_4_;
            auVar9._4_4_ = auVar157._4_4_ * 0.055555556;
            auVar9._0_4_ = auVar157._0_4_ * 0.055555556;
            auVar9._8_4_ = auVar157._8_4_ * 0.055555556;
            auVar9._12_4_ = auVar157._12_4_ * 0.055555556;
            auVar9._16_4_ = auVar157._16_4_ * 0.055555556;
            auVar9._20_4_ = auVar157._20_4_ * 0.055555556;
            auVar9._24_4_ = auVar157._24_4_ * 0.055555556;
            auVar9._28_4_ = auVar157._28_4_;
            auVar157._4_4_ = auVar149._4_4_ * 0.055555556;
            auVar157._0_4_ = auVar149._0_4_ * 0.055555556;
            auVar157._8_4_ = auVar149._8_4_ * 0.055555556;
            auVar157._12_4_ = auVar149._12_4_ * 0.055555556;
            auVar157._16_4_ = auVar149._16_4_ * 0.055555556;
            auVar157._20_4_ = auVar149._20_4_ * 0.055555556;
            auVar157._24_4_ = auVar149._24_4_ * 0.055555556;
            auVar157._28_4_ = auVar149._28_4_;
            auVar133 = vsubps_avx(auVar170,auVar133);
            auVar102 = vsubps_avx(auVar80,auVar9);
            auVar16 = vsubps_avx(auVar90,auVar157);
            auVar9 = vblendps_avx(auVar100,auVar158,0x80);
            auVar157 = vblendps_avx(auVar59,auVar158,0x80);
            auVar149 = vblendps_avx(auVar114,auVar158,0x80);
            auVar101._0_4_ = auVar170._0_4_ + auVar9._0_4_ * 0.055555556;
            auVar101._4_4_ = auVar170._4_4_ + auVar9._4_4_ * 0.055555556;
            auVar101._8_4_ = auVar170._8_4_ + auVar9._8_4_ * 0.055555556;
            auVar101._12_4_ = auVar170._12_4_ + auVar9._12_4_ * 0.055555556;
            auVar101._16_4_ = auVar170._16_4_ + auVar9._16_4_ * 0.055555556;
            auVar101._20_4_ = auVar170._20_4_ + auVar9._20_4_ * 0.055555556;
            auVar101._24_4_ = auVar170._24_4_ + auVar9._24_4_ * 0.055555556;
            auVar101._28_4_ = auVar170._28_4_ + auVar9._28_4_;
            auVar148._0_4_ = auVar80._0_4_ + auVar157._0_4_ * 0.055555556;
            auVar148._4_4_ = auVar80._4_4_ + auVar157._4_4_ * 0.055555556;
            auVar148._8_4_ = auVar80._8_4_ + auVar157._8_4_ * 0.055555556;
            auVar148._12_4_ = auVar80._12_4_ + auVar157._12_4_ * 0.055555556;
            auVar148._16_4_ = auVar80._16_4_ + auVar157._16_4_ * 0.055555556;
            auVar148._20_4_ = auVar80._20_4_ + auVar157._20_4_ * 0.055555556;
            auVar148._24_4_ = auVar80._24_4_ + auVar157._24_4_ * 0.055555556;
            auVar148._28_4_ = auVar80._28_4_ + auVar157._28_4_;
            auVar115._0_4_ = auVar90._0_4_ + auVar149._0_4_ * 0.055555556;
            auVar115._4_4_ = auVar90._4_4_ + auVar149._4_4_ * 0.055555556;
            auVar115._8_4_ = auVar90._8_4_ + auVar149._8_4_ * 0.055555556;
            auVar115._12_4_ = auVar90._12_4_ + auVar149._12_4_ * 0.055555556;
            auVar115._16_4_ = auVar90._16_4_ + auVar149._16_4_ * 0.055555556;
            auVar115._20_4_ = auVar90._20_4_ + auVar149._20_4_ * 0.055555556;
            auVar115._24_4_ = auVar90._24_4_ + auVar149._24_4_ * 0.055555556;
            auVar115._28_4_ = auVar90._28_4_ + auVar149._28_4_;
            auVar70._8_4_ = 0x7f800000;
            auVar70._0_8_ = 0x7f8000007f800000;
            auVar70._12_4_ = 0x7f800000;
            auVar70._16_4_ = 0x7f800000;
            auVar70._20_4_ = 0x7f800000;
            auVar70._24_4_ = 0x7f800000;
            auVar70._28_4_ = 0x7f800000;
            auVar9 = vminps_avx(auVar70,auVar170);
            auVar157 = vminps_avx(auVar70,auVar80);
            auVar149 = vminps_avx(auVar133,auVar101);
            auVar158 = vminps_avx(auVar9,auVar149);
            auVar9 = vminps_avx(auVar102,auVar148);
            auVar14 = vminps_avx(auVar157,auVar9);
            auVar9 = vminps_avx(auVar70,auVar90);
            auVar157 = vminps_avx(auVar16,auVar115);
            auVar15 = vminps_avx(auVar9,auVar157);
            auVar175._0_4_ = (fVar147 + auVar67._0_4_) * 0.33333334 + (float)local_358._0_4_;
            auVar175._4_4_ = (fVar154 + auVar67._4_4_) * 0.33333334 + (float)local_358._4_4_;
            auVar175._8_4_ = (fVar163 + auVar67._8_4_) * 0.33333334 + fStack_350;
            auVar175._12_4_ = (fVar165 + auVar67._12_4_) * 0.33333334 + fStack_34c;
            auVar56._0_4_ = (auVar110._0_4_ + auVar68._0_4_) * 0.33333334;
            auVar56._4_4_ = (auVar110._4_4_ + auVar68._4_4_) * 0.33333334;
            auVar56._8_4_ = (auVar110._8_4_ + auVar68._8_4_) * 0.33333334;
            auVar56._12_4_ = (auVar110._12_4_ + auVar68._12_4_) * 0.33333334;
            auVar64 = vsubps_avx(_local_338,auVar56);
            auVar167._8_4_ = 0xff800000;
            auVar167._0_8_ = 0xff800000ff800000;
            auVar167._12_4_ = 0xff800000;
            auVar167._16_4_ = 0xff800000;
            auVar167._20_4_ = 0xff800000;
            auVar167._24_4_ = 0xff800000;
            auVar167._28_4_ = 0xff800000;
            auVar9 = vmaxps_avx(auVar167,auVar170);
            auVar157 = vmaxps_avx(auVar167,auVar80);
            auVar149 = vmaxps_avx(auVar167,auVar90);
            auVar133 = vmaxps_avx(auVar133,auVar101);
            auVar9 = vmaxps_avx(auVar9,auVar133);
            auVar133 = vmaxps_avx(auVar102,auVar148);
            auVar157 = vmaxps_avx(auVar157,auVar133);
            auVar133 = vmaxps_avx(auVar16,auVar115);
            auVar149 = vmaxps_avx(auVar149,auVar133);
            auVar133 = vshufps_avx(auVar158,auVar158,0xb1);
            auVar133 = vminps_avx(auVar158,auVar133);
            auVar102 = vshufpd_avx(auVar133,auVar133,5);
            auVar133 = vminps_avx(auVar133,auVar102);
            auVar51 = vminps_avx(auVar133._0_16_,auVar133._16_16_);
            auVar133 = vshufps_avx(auVar14,auVar14,0xb1);
            auVar133 = vminps_avx(auVar14,auVar133);
            auVar102 = vshufpd_avx(auVar133,auVar133,5);
            auVar133 = vminps_avx(auVar133,auVar102);
            auVar63 = vminps_avx(auVar133._0_16_,auVar133._16_16_);
            auVar63 = vunpcklps_avx(auVar51,auVar63);
            auVar133 = vshufps_avx(auVar15,auVar15,0xb1);
            auVar133 = vminps_avx(auVar15,auVar133);
            auVar15 = vshufpd_avx(auVar133,auVar133,5);
            auVar133 = vminps_avx(auVar133,auVar15);
            auVar51 = vminps_avx(auVar133._0_16_,auVar133._16_16_);
            auVar51 = vinsertps_avx(auVar63,auVar51,0x28);
            auVar133 = vshufps_avx(auVar9,auVar9,0xb1);
            auVar9 = vmaxps_avx(auVar9,auVar133);
            auVar133 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vmaxps_avx(auVar9,auVar133);
            auVar63 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
            auVar9 = vshufps_avx(auVar157,auVar157,0xb1);
            auVar9 = vmaxps_avx(auVar157,auVar9);
            auVar157 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vmaxps_avx(auVar9,auVar157);
            auVar52 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
            auVar52 = vunpcklps_avx(auVar63,auVar52);
            auVar9 = vshufps_avx(auVar149,auVar149,0xb1);
            auVar9 = vmaxps_avx(auVar149,auVar9);
            auVar157 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vmaxps_avx(auVar9,auVar157);
            auVar63 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
            auVar63 = vinsertps_avx(auVar52,auVar63,0x28);
            auVar52 = vshufps_avx(auVar175,auVar175,0);
            auVar56 = vshufps_avx(auVar175,auVar175,0x55);
            local_f8._16_16_ = auVar56;
            local_f8._0_16_ = auVar56;
            auVar53 = vshufps_avx(auVar175,auVar175,0xaa);
            local_118._16_16_ = auVar53;
            local_118._0_16_ = auVar53;
            auVar54 = vshufps_avx(auVar64,auVar64,0);
            auVar66 = vshufps_avx(auVar64,auVar64,0x55);
            auVar64 = vshufps_avx(auVar64,auVar64,0xaa);
            auVar55 = vshufps_avx(_local_338,_local_338,0);
            auVar68 = vshufps_avx(_local_338,_local_338,0x55);
            auVar65 = vshufps_avx(_local_338,_local_338,0xaa);
            fVar137 = auVar55._0_4_;
            fVar142 = auVar55._4_4_;
            fVar143 = auVar55._8_4_;
            fVar144 = auVar55._12_4_;
            fVar145 = auVar68._0_4_;
            fVar125 = auVar68._4_4_;
            fVar126 = auVar68._8_4_;
            fVar127 = auVar68._12_4_;
            fVar128 = auVar65._0_4_;
            fVar135 = auVar65._4_4_;
            fVar136 = auVar65._8_4_;
            fVar85 = auVar54._0_4_;
            fVar93 = auVar54._4_4_;
            fVar94 = auVar54._8_4_;
            fVar159 = auVar54._12_4_;
            fVar95 = auVar158._28_4_;
            fVar96 = auVar66._0_4_;
            fVar103 = auVar66._4_4_;
            fVar104 = auVar66._8_4_;
            fVar105 = auVar66._12_4_;
            fVar106 = auVar64._0_4_;
            fVar117 = auVar64._4_4_;
            fVar118 = auVar64._8_4_;
            fVar119 = auVar64._12_4_;
            fVar161 = auVar52._0_4_;
            fVar163 = auVar52._4_4_;
            fVar164 = auVar52._8_4_;
            fVar75 = auVar56._0_4_;
            fVar83 = auVar56._4_4_;
            fVar84 = auVar56._8_4_;
            fVar165 = auVar53._0_4_;
            fVar166 = auVar53._4_4_;
            fVar168 = auVar53._8_4_;
            auVar54 = vshufps_avx(_local_358,_local_358,0);
            fVar62 = auVar54._0_4_;
            fVar73 = auVar54._4_4_;
            fVar146 = auVar54._8_4_;
            fVar153 = auVar54._12_4_;
            auVar71._0_4_ =
                 local_2c8 * fVar62 +
                 fVar161 * (float)local_1e8._0_4_ + fVar85 * local_208 + fVar137 * local_178;
            auVar71._4_4_ =
                 fStack_2c4 * fVar73 +
                 fVar163 * (float)local_1e8._4_4_ + fVar93 * fStack_204 + fVar142 * fStack_174;
            auVar71._8_4_ =
                 fStack_2c0 * fVar146 +
                 fVar164 * fStack_1e0 + fVar94 * fStack_200 + fVar143 * fStack_170;
            auVar71._12_4_ =
                 fStack_2bc * fVar153 +
                 auVar52._12_4_ * fStack_1dc + fVar159 * fStack_1fc + fVar144 * fStack_16c;
            auVar71._16_4_ =
                 fStack_2b8 * fVar62 +
                 fVar161 * fStack_1d8 + fVar85 * fStack_1f8 + fVar137 * fStack_168;
            auVar71._20_4_ =
                 fStack_2b4 * fVar73 +
                 fVar163 * fStack_1d4 + fVar93 * fStack_1f4 + fVar142 * fStack_164;
            auVar71._24_4_ =
                 fStack_2b0 * fVar146 +
                 fVar164 * fStack_1d0 + fVar94 * fStack_1f0 + fVar143 * fStack_160;
            auVar71._28_4_ = fVar95 + fVar95 + 0.0 + 0.0;
            auVar54 = vshufps_avx(_local_358,_local_358,0x55);
            fVar72 = auVar54._0_4_;
            fVar74 = auVar54._4_4_;
            fVar151 = auVar54._8_4_;
            fVar155 = auVar54._12_4_;
            auVar171._0_4_ =
                 local_2c8 * fVar72 +
                 fVar75 * (float)local_1e8._0_4_ + fVar96 * local_208 + fVar145 * local_178;
            auVar171._4_4_ =
                 fStack_2c4 * fVar74 +
                 fVar83 * (float)local_1e8._4_4_ + fVar103 * fStack_204 + fVar125 * fStack_174;
            auVar171._8_4_ =
                 fStack_2c0 * fVar151 +
                 fVar84 * fStack_1e0 + fVar104 * fStack_200 + fVar126 * fStack_170;
            auVar171._12_4_ =
                 fStack_2bc * fVar155 +
                 auVar56._12_4_ * fStack_1dc + fVar105 * fStack_1fc + fVar127 * fStack_16c;
            auVar171._16_4_ =
                 fStack_2b8 * fVar72 +
                 fVar75 * fStack_1d8 + fVar96 * fStack_1f8 + fVar145 * fStack_168;
            auVar171._20_4_ =
                 fStack_2b4 * fVar74 +
                 fVar83 * fStack_1d4 + fVar103 * fStack_1f4 + fVar125 * fStack_164;
            auVar171._24_4_ =
                 fStack_2b0 * fVar151 +
                 fVar84 * fStack_1d0 + fVar104 * fStack_1f0 + fVar126 * fStack_160;
            auVar171._28_4_ = fVar95 + fVar95 + auVar148._28_4_ + 0.0;
            auVar54 = vshufps_avx(_local_358,_local_358,0xaa);
            fVar147 = auVar54._0_4_;
            fVar152 = auVar54._4_4_;
            fVar154 = auVar54._8_4_;
            auVar160._0_4_ =
                 fVar147 * local_2c8 +
                 fVar165 * (float)local_1e8._0_4_ + fVar106 * local_208 + fVar128 * local_178;
            auVar160._4_4_ =
                 fVar152 * fStack_2c4 +
                 fVar166 * (float)local_1e8._4_4_ + fVar117 * fStack_204 + fVar135 * fStack_174;
            auVar160._8_4_ =
                 fVar154 * fStack_2c0 +
                 fVar168 * fStack_1e0 + fVar118 * fStack_200 + fVar136 * fStack_170;
            auVar160._12_4_ =
                 auVar54._12_4_ * fStack_2bc +
                 auVar53._12_4_ * fStack_1dc + fVar119 * fStack_1fc + auVar65._12_4_ * fStack_16c;
            auVar160._16_4_ =
                 fVar147 * fStack_2b8 +
                 fVar165 * fStack_1d8 + fVar106 * fStack_1f8 + fVar128 * fStack_168;
            auVar160._20_4_ =
                 fVar152 * fStack_2b4 +
                 fVar166 * fStack_1d4 + fVar117 * fStack_1f4 + fVar135 * fStack_164;
            auVar160._24_4_ =
                 fVar154 * fStack_2b0 +
                 fVar168 * fStack_1d0 + fVar118 * fStack_1f0 + fVar136 * fStack_160;
            auVar160._28_4_ = fVar95 + fVar95 + auVar14._28_4_ + 0.0;
            fVar95 = fVar127 + fVar144 + fVar159;
            auVar81._0_4_ =
                 fVar62 * local_1c8 + fVar161 * local_198 + fVar137 * local_d8 + local_b8 * fVar85;
            auVar81._4_4_ =
                 fVar73 * fVar49 + fVar163 * fStack_194 + fVar142 * fStack_d4 + fStack_b4 * fVar93;
            auVar81._8_4_ =
                 fVar146 * fStack_1c0 +
                 fVar164 * fStack_190 + fVar143 * fStack_d0 + fStack_b0 * fVar94;
            auVar81._12_4_ =
                 fVar153 * fStack_1bc +
                 auVar52._12_4_ * fStack_18c + fVar144 * fStack_cc + fStack_ac * fVar159;
            auVar81._16_4_ =
                 fVar62 * fStack_1b8 +
                 fVar161 * fStack_188 + fVar137 * fStack_c8 + fStack_a8 * fVar85;
            auVar81._20_4_ =
                 fVar73 * fStack_1b4 +
                 fVar163 * fStack_184 + fVar142 * fStack_c4 + fStack_a4 * fVar93;
            auVar81._24_4_ =
                 fVar146 * fStack_1b0 +
                 fVar164 * fStack_180 + fVar143 * fStack_c0 + fStack_a0 * fVar94;
            auVar81._28_4_ = fVar153 + fVar95;
            auVar60._0_4_ =
                 fVar72 * local_1c8 + local_198 * fVar75 + local_b8 * fVar96 + local_d8 * fVar145;
            auVar60._4_4_ =
                 fVar74 * fVar49 + fStack_194 * fVar83 + fStack_b4 * fVar103 + fStack_d4 * fVar125;
            auVar60._8_4_ =
                 fVar151 * fStack_1c0 +
                 fStack_190 * fVar84 + fStack_b0 * fVar104 + fStack_d0 * fVar126;
            auVar60._12_4_ =
                 fVar155 * fStack_1bc +
                 fStack_18c * auVar56._12_4_ + fStack_ac * fVar105 + fStack_cc * fVar127;
            auVar60._16_4_ =
                 fVar72 * fStack_1b8 +
                 fStack_188 * fVar75 + fStack_a8 * fVar96 + fStack_c8 * fVar145;
            auVar60._20_4_ =
                 fVar74 * fStack_1b4 +
                 fStack_184 * fVar83 + fStack_a4 * fVar103 + fStack_c4 * fVar125;
            auVar60._24_4_ =
                 fVar151 * fStack_1b0 +
                 fStack_180 * fVar84 + fStack_a0 * fVar104 + fStack_c0 * fVar126;
            auVar60._28_4_ = fVar155 + fVar127 + fVar105 + fVar127;
            auVar91._0_4_ =
                 fVar147 * local_1c8 + local_198 * fVar165 + local_b8 * fVar106 + local_d8 * fVar128
            ;
            auVar91._4_4_ =
                 fVar152 * fVar49 + fStack_194 * fVar166 + fStack_b4 * fVar117 + fStack_d4 * fVar135
            ;
            auVar91._8_4_ =
                 fVar154 * fStack_1c0 +
                 fStack_190 * fVar168 + fStack_b0 * fVar118 + fStack_d0 * fVar136;
            auVar91._12_4_ =
                 auVar54._12_4_ * fStack_1bc +
                 fStack_18c * auVar53._12_4_ + fStack_ac * fVar119 + fStack_cc * auVar65._12_4_;
            auVar91._16_4_ =
                 fVar147 * fStack_1b8 +
                 fStack_188 * fVar165 + fStack_a8 * fVar106 + fStack_c8 * fVar128;
            auVar91._20_4_ =
                 fVar152 * fStack_1b4 +
                 fStack_184 * fVar166 + fStack_a4 * fVar117 + fStack_c4 * fVar135;
            auVar91._24_4_ =
                 fVar154 * fStack_1b0 +
                 fStack_180 * fVar168 + fStack_a0 * fVar118 + fStack_c0 * fVar136;
            auVar91._28_4_ = fVar95 + fVar127 + fVar119 + fVar127;
            auVar9 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,1);
            auVar157 = vblendps_avx(auVar60,ZEXT832(0) << 0x20,1);
            auVar133 = ZEXT832(0) << 0x20;
            auVar149 = vblendps_avx(auVar91,auVar133,1);
            auVar158._4_4_ = auVar9._4_4_ * 0.055555556;
            auVar158._0_4_ = auVar9._0_4_ * 0.055555556;
            auVar158._8_4_ = auVar9._8_4_ * 0.055555556;
            auVar158._12_4_ = auVar9._12_4_ * 0.055555556;
            auVar158._16_4_ = auVar9._16_4_ * 0.055555556;
            auVar158._20_4_ = auVar9._20_4_ * 0.055555556;
            auVar158._24_4_ = auVar9._24_4_ * 0.055555556;
            auVar158._28_4_ = auVar9._28_4_;
            auVar14._4_4_ = auVar157._4_4_ * 0.055555556;
            auVar14._0_4_ = auVar157._0_4_ * 0.055555556;
            auVar14._8_4_ = auVar157._8_4_ * 0.055555556;
            auVar14._12_4_ = auVar157._12_4_ * 0.055555556;
            auVar14._16_4_ = auVar157._16_4_ * 0.055555556;
            auVar14._20_4_ = auVar157._20_4_ * 0.055555556;
            auVar14._24_4_ = auVar157._24_4_ * 0.055555556;
            auVar14._28_4_ = auVar157._28_4_;
            auVar15._4_4_ = auVar149._4_4_ * 0.055555556;
            auVar15._0_4_ = auVar149._0_4_ * 0.055555556;
            auVar15._8_4_ = auVar149._8_4_ * 0.055555556;
            auVar15._12_4_ = auVar149._12_4_ * 0.055555556;
            auVar15._16_4_ = auVar149._16_4_ * 0.055555556;
            auVar15._20_4_ = auVar149._20_4_ * 0.055555556;
            auVar15._24_4_ = auVar149._24_4_ * 0.055555556;
            auVar15._28_4_ = auVar149._28_4_;
            auVar102 = vsubps_avx(auVar71,auVar158);
            auVar16 = vsubps_avx(auVar171,auVar14);
            auVar59 = vsubps_avx(auVar160,auVar15);
            auVar9 = vblendps_avx(auVar81,auVar133,0x80);
            auVar157 = vblendps_avx(auVar60,auVar133,0x80);
            auVar149 = vblendps_avx(auVar91,auVar133,0x80);
            auVar82._0_4_ = auVar71._0_4_ + auVar9._0_4_ * 0.055555556;
            auVar82._4_4_ = auVar71._4_4_ + auVar9._4_4_ * 0.055555556;
            auVar82._8_4_ = auVar71._8_4_ + auVar9._8_4_ * 0.055555556;
            auVar82._12_4_ = auVar71._12_4_ + auVar9._12_4_ * 0.055555556;
            auVar82._16_4_ = auVar71._16_4_ + auVar9._16_4_ * 0.055555556;
            auVar82._20_4_ = auVar71._20_4_ + auVar9._20_4_ * 0.055555556;
            auVar82._24_4_ = auVar71._24_4_ + auVar9._24_4_ * 0.055555556;
            auVar82._28_4_ = auVar71._28_4_ + auVar9._28_4_;
            auVar61._0_4_ = auVar171._0_4_ + auVar157._0_4_ * 0.055555556;
            auVar61._4_4_ = auVar171._4_4_ + auVar157._4_4_ * 0.055555556;
            auVar61._8_4_ = auVar171._8_4_ + auVar157._8_4_ * 0.055555556;
            auVar61._12_4_ = auVar171._12_4_ + auVar157._12_4_ * 0.055555556;
            auVar61._16_4_ = auVar171._16_4_ + auVar157._16_4_ * 0.055555556;
            auVar61._20_4_ = auVar171._20_4_ + auVar157._20_4_ * 0.055555556;
            auVar61._24_4_ = auVar171._24_4_ + auVar157._24_4_ * 0.055555556;
            auVar61._28_4_ = auVar171._28_4_ + auVar157._28_4_;
            auVar92._0_4_ = auVar160._0_4_ + auVar149._0_4_ * 0.055555556;
            auVar92._4_4_ = auVar160._4_4_ + auVar149._4_4_ * 0.055555556;
            auVar92._8_4_ = auVar160._8_4_ + auVar149._8_4_ * 0.055555556;
            auVar92._12_4_ = auVar160._12_4_ + auVar149._12_4_ * 0.055555556;
            auVar92._16_4_ = auVar160._16_4_ + auVar149._16_4_ * 0.055555556;
            auVar92._20_4_ = auVar160._20_4_ + auVar149._20_4_ * 0.055555556;
            auVar92._24_4_ = auVar160._24_4_ + auVar149._24_4_ * 0.055555556;
            auVar92._28_4_ = auVar160._28_4_ + auVar149._28_4_;
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar9 = vminps_avx(auVar149,auVar71);
            auVar157 = vminps_avx(auVar149,auVar171);
            auVar149 = vminps_avx(auVar149,auVar160);
            auVar133 = vminps_avx(auVar102,auVar82);
            auVar158 = vminps_avx(auVar9,auVar133);
            auVar9 = vminps_avx(auVar16,auVar61);
            auVar14 = vminps_avx(auVar157,auVar9);
            auVar9 = vminps_avx(auVar59,auVar92);
            auVar15 = vminps_avx(auVar149,auVar9);
            auVar9 = vmaxps_avx(auVar102,auVar82);
            auVar102._8_4_ = 0xff800000;
            auVar102._0_8_ = 0xff800000ff800000;
            auVar102._12_4_ = 0xff800000;
            auVar102._16_4_ = 0xff800000;
            auVar102._20_4_ = 0xff800000;
            auVar102._24_4_ = 0xff800000;
            auVar102._28_4_ = 0xff800000;
            auVar157 = vmaxps_avx(auVar102,auVar71);
            auVar9 = vmaxps_avx(auVar157,auVar9);
            auVar157 = vmaxps_avx(auVar16,auVar61);
            auVar149 = vmaxps_avx(auVar102,auVar171);
            auVar157 = vmaxps_avx(auVar149,auVar157);
            auVar149 = vmaxps_avx(auVar59,auVar92);
            auVar133 = vmaxps_avx(auVar102,auVar160);
            auVar149 = vmaxps_avx(auVar133,auVar149);
            auVar133 = vshufps_avx(auVar158,auVar158,0xb1);
            auVar133 = vminps_avx(auVar158,auVar133);
            auVar132._8_4_ = 0x5dccb9a2;
            auVar132._0_8_ = 0x5dccb9a25dccb9a2;
            auVar132._12_4_ = 0x5dccb9a2;
            auVar134 = ZEXT1664(auVar132);
            auVar158 = vshufpd_avx(auVar133,auVar133,5);
            auVar133 = vminps_avx(auVar133,auVar158);
            auVar52 = vminps_avx(auVar133._0_16_,auVar133._16_16_);
            auVar133 = vshufps_avx(auVar14,auVar14,0xb1);
            auVar133 = vminps_avx(auVar14,auVar133);
            auVar140._8_4_ = 0xddccb9a2;
            auVar140._0_8_ = 0xddccb9a2ddccb9a2;
            auVar140._12_4_ = 0xddccb9a2;
            auVar141 = ZEXT1664(auVar140);
            auVar158 = vshufpd_avx(auVar133,auVar133,5);
            auVar133 = vminps_avx(auVar133,auVar158);
            auVar56 = vminps_avx(auVar133._0_16_,auVar133._16_16_);
            auVar56 = vunpcklps_avx(auVar52,auVar56);
            auVar133 = vshufps_avx(auVar15,auVar15,0xb1);
            auVar133 = vminps_avx(auVar15,auVar133);
            auVar158 = vshufpd_avx(auVar133,auVar133,5);
            auVar133 = vminps_avx(auVar133,auVar158);
            auVar52 = vminps_avx(auVar133._0_16_,auVar133._16_16_);
            auVar52 = vinsertps_avx(auVar56,auVar52,0x28);
            auVar56 = vminps_avx(auVar51,auVar52);
            auVar133 = vshufps_avx(auVar9,auVar9,0xb1);
            auVar9 = vmaxps_avx(auVar9,auVar133);
            auVar133 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vmaxps_avx(auVar9,auVar133);
            auVar51 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
            auVar9 = vshufps_avx(auVar157,auVar157,0xb1);
            auVar9 = vmaxps_avx(auVar157,auVar9);
            auVar157 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vmaxps_avx(auVar9,auVar157);
            auVar52 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
            auVar52 = vunpcklps_avx(auVar51,auVar52);
            auVar9 = vshufps_avx(auVar149,auVar149,0xb1);
            auVar9 = vmaxps_avx(auVar149,auVar9);
            auVar157 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vmaxps_avx(auVar9,auVar157);
            auVar51 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
            auVar51 = vinsertps_avx(auVar52,auVar51,0x28);
            auVar63 = vmaxps_avx(auVar63,auVar51);
            auVar51 = vcmpps_avx(auVar56,auVar140,6);
            auVar63 = vcmpps_avx(auVar63,auVar132,1);
            auVar51 = vandps_avx(auVar63,auVar51);
            uVar46 = vmovmskps_avx(auVar51);
            if ((~(byte)uVar46 & 7) != 0) {
              auVar116 = ZEXT1664(auVar107);
              auVar124 = ZEXT1664(auVar120);
              auVar150 = ZEXT864(0) << 0x20;
              goto LAB_012468b8;
            }
            uVar40 = uVar40 + 1;
            lVar42 = lVar42 + 0x38;
            auVar116 = ZEXT1664(auVar107);
            auVar124 = ZEXT1664(auVar120);
            auVar63 = ZEXT816(0) << 0x20;
            auVar150 = ZEXT864(0) << 0x20;
          } while (uVar40 <= (ulong)(long)(int)auVar108._0_4_);
          auVar51._8_8_ = 0;
          auVar51._0_4_ =
               (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.time_range.lower;
          auVar51._4_4_ =
               (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.time_range.upper;
          _fStack_1f8 = bezier_basis0._2804_8_;
          _fStack_1f0 = bezier_basis0._2812_8_;
          _fStack_1d8 = bezier_basis0._1648_8_;
          _fStack_1d0 = bezier_basis0._1656_8_;
          _fStack_1c0 = bezier_basis0._5108_8_;
          _fStack_1b8 = bezier_basis0._5116_8_;
          _fStack_1b0 = bezier_basis0._5124_8_;
          _local_198 = bezier_basis0._6256_8_;
          _fStack_190 = bezier_basis0._6264_8_;
          _fStack_188 = bezier_basis0._6272_8_;
          _fStack_180 = bezier_basis0._6280_8_;
          _fStack_168 = bezier_basis0._3960_8_;
          _fStack_160 = bezier_basis0._3968_8_;
          _local_d8 = bezier_basis0._8568_8_;
          _fStack_d0 = bezier_basis0._8576_8_;
          _fStack_c8 = bezier_basis0._8584_8_;
          _fStack_c0 = bezier_basis0._8592_8_;
          fStack_1c4 = fVar49;
          unique0x1000d3f0 = auVar20;
        }
        fVar50 = auVar51._0_4_;
        auVar112 = vmovshdup_avx(auVar51);
        local_208 = auVar112._0_4_ - fVar50;
        local_1c8 = (t0t1->lower - fVar50) / local_208;
        local_208 = (t0t1->upper - fVar50) / local_208;
        fVar50 = fVar2 * local_1c8;
        fVar49 = fVar2 * local_208;
        auVar108 = vroundss_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50),9);
        auVar52 = vroundss_avx(ZEXT416((uint)fVar49),ZEXT416((uint)fVar49),10);
        auVar112 = vmaxss_avx(auVar108,auVar63);
        local_1e8._0_4_ = auVar112._0_4_;
        auVar51 = vminss_avx(auVar52,ZEXT416((uint)fVar2));
        iVar43 = (int)auVar112._0_4_;
        fVar62 = auVar51._0_4_;
        local_1a8.primID = &local_210;
        uVar37 = (int)auVar108._0_4_;
        if ((int)auVar108._0_4_ < 0) {
          uVar37 = 0xffffffff;
        }
        iVar47 = (int)fVar2 + 1;
        if ((int)auVar52._0_4_ < (int)fVar2 + 1) {
          iVar47 = (int)auVar52._0_4_;
        }
        local_210 = uVar41;
        local_1a8.this =
             (CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
              *)this;
        ::anon_func::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_138.field_1,&local_1a8,(long)iVar43);
        ::anon_func::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_158.field_1,&local_1a8,(long)(int)fVar62);
        fVar50 = fVar50 - (float)local_1e8._0_4_;
        if (iVar47 - uVar37 == 1) {
          auVar112 = ZEXT816(0) << 0x40;
          auVar51 = vmaxss_avx(ZEXT416((uint)fVar50),auVar112);
          auVar63 = vshufps_avx(auVar51,auVar51,0);
          auVar51 = ZEXT416((uint)(1.0 - auVar51._0_4_));
          auVar51 = vshufps_avx(auVar51,auVar51,0);
          auVar156._0_4_ = auVar63._0_4_ * local_158.m128[0] + auVar51._0_4_ * local_138.m128[0];
          auVar156._4_4_ = auVar63._4_4_ * local_158.m128[1] + auVar51._4_4_ * local_138.m128[1];
          auVar156._8_4_ = auVar63._8_4_ * local_158.m128[2] + auVar51._8_4_ * local_138.m128[2];
          auVar156._12_4_ = auVar63._12_4_ * local_158.m128[3] + auVar51._12_4_ * local_138.m128[3];
          auVar129._0_4_ = auVar63._0_4_ * local_148 + auVar51._0_4_ * local_128;
          auVar129._4_4_ = auVar63._4_4_ * fStack_144 + auVar51._4_4_ * fStack_124;
          auVar129._8_4_ = auVar63._8_4_ * fStack_140 + auVar51._8_4_ * fStack_120;
          auVar129._12_4_ = auVar63._12_4_ * fStack_13c + auVar51._12_4_ * fStack_11c;
          auVar51 = vmaxss_avx(ZEXT416((uint)(fVar62 - fVar49)),auVar112);
          auVar63 = vshufps_avx(auVar51,auVar51,0);
          auVar51 = ZEXT416((uint)(1.0 - auVar51._0_4_));
          auVar51 = vshufps_avx(auVar51,auVar51,0);
          auVar108._0_4_ = auVar51._0_4_ * local_158.m128[0] + auVar63._0_4_ * local_138.m128[0];
          auVar108._4_4_ = auVar51._4_4_ * local_158.m128[1] + auVar63._4_4_ * local_138.m128[1];
          auVar108._8_4_ = auVar51._8_4_ * local_158.m128[2] + auVar63._8_4_ * local_138.m128[2];
          auVar108._12_4_ = auVar51._12_4_ * local_158.m128[3] + auVar63._12_4_ * local_138.m128[3];
          auVar121._0_4_ = auVar51._0_4_ * local_148 + auVar63._0_4_ * local_128;
          auVar121._4_4_ = auVar51._4_4_ * fStack_144 + auVar63._4_4_ * fStack_124;
          auVar121._8_4_ = auVar51._8_4_ * fStack_140 + auVar63._8_4_ * fStack_120;
          auVar121._12_4_ = auVar51._12_4_ * fStack_13c + auVar63._12_4_ * fStack_11c;
        }
        else {
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_1a8,(long)(iVar43 + 1));
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_1a8,(long)((int)fVar62 + -1));
          auVar112 = vmaxss_avx(ZEXT416((uint)fVar50),ZEXT816(0) << 0x40);
          auVar51 = vshufps_avx(auVar112,auVar112,0);
          auVar112 = ZEXT416((uint)(1.0 - auVar112._0_4_));
          auVar112 = vshufps_avx(auVar112,auVar112,0);
          auVar156._0_4_ = auVar51._0_4_ * local_58.m128[0] + auVar112._0_4_ * local_138.m128[0];
          auVar156._4_4_ = auVar51._4_4_ * local_58.m128[1] + auVar112._4_4_ * local_138.m128[1];
          auVar156._8_4_ = auVar51._8_4_ * local_58.m128[2] + auVar112._8_4_ * local_138.m128[2];
          auVar156._12_4_ = auVar51._12_4_ * local_58.m128[3] + auVar112._12_4_ * local_138.m128[3];
          auVar129._0_4_ = auVar51._0_4_ * local_48 + auVar112._0_4_ * local_128;
          auVar129._4_4_ = auVar51._4_4_ * fStack_44 + auVar112._4_4_ * fStack_124;
          auVar129._8_4_ = auVar51._8_4_ * fStack_40 + auVar112._8_4_ * fStack_120;
          auVar129._12_4_ = auVar51._12_4_ * fStack_3c + auVar112._12_4_ * fStack_11c;
          auVar112 = vmaxss_avx(ZEXT416((uint)(fVar62 - fVar49)),ZEXT816(0) << 0x40);
          auVar51 = vshufps_avx(auVar112,auVar112,0);
          auVar112 = ZEXT416((uint)(1.0 - auVar112._0_4_));
          auVar112 = vshufps_avx(auVar112,auVar112,0);
          auVar108._0_4_ = auVar51._0_4_ * local_78.m128[0] + auVar112._0_4_ * local_158.m128[0];
          auVar108._4_4_ = auVar51._4_4_ * local_78.m128[1] + auVar112._4_4_ * local_158.m128[1];
          auVar108._8_4_ = auVar51._8_4_ * local_78.m128[2] + auVar112._8_4_ * local_158.m128[2];
          auVar108._12_4_ = auVar51._12_4_ * local_78.m128[3] + auVar112._12_4_ * local_158.m128[3];
          auVar121._0_4_ = auVar51._0_4_ * local_68 + auVar112._0_4_ * local_148;
          auVar121._4_4_ = auVar51._4_4_ * fStack_64 + auVar112._4_4_ * fStack_144;
          auVar121._8_4_ = auVar51._8_4_ * fStack_60 + auVar112._8_4_ * fStack_140;
          auVar121._12_4_ = auVar51._12_4_ * fStack_5c + auVar112._12_4_ * fStack_13c;
          if ((int)(uVar37 + 1) < iVar47) {
            local_198 = local_208 - local_1c8;
            itime = (size_t)(uVar37 + 1);
            iVar47 = ~uVar37 + iVar47;
            do {
              auVar57._0_4_ = ((float)(int)itime / fVar2 - local_1c8) / local_198;
              auVar57._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar112 = vshufps_avx(auVar57,auVar57,0);
              fVar50 = auVar108._4_4_;
              fVar49 = auVar108._8_4_;
              fVar62 = auVar108._12_4_;
              auVar51 = vshufps_avx(ZEXT416((uint)(1.0 - auVar57._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar57._0_4_)),0);
              fVar146 = auVar156._4_4_;
              fVar151 = auVar156._8_4_;
              fVar153 = auVar156._12_4_;
              local_208 = auVar108._0_4_ * auVar112._0_4_ + auVar156._0_4_ * auVar51._0_4_;
              fStack_204 = fVar50 * auVar112._4_4_ + fVar146 * auVar51._4_4_;
              fStack_200 = fVar49 * auVar112._8_4_ + fVar151 * auVar51._8_4_;
              fStack_1fc = fVar62 * auVar112._12_4_ + fVar153 * auVar51._12_4_;
              fVar72 = auVar129._4_4_;
              fVar73 = auVar129._8_4_;
              fVar74 = auVar129._12_4_;
              local_178 = auVar121._0_4_ * auVar112._0_4_ + auVar129._0_4_ * auVar51._0_4_;
              fStack_174 = auVar121._4_4_ * auVar112._4_4_ + fVar72 * auVar51._4_4_;
              fStack_170 = auVar121._8_4_ * auVar112._8_4_ + fVar73 * auVar51._8_4_;
              fStack_16c = auVar121._12_4_ * auVar112._12_4_ + fVar74 * auVar51._12_4_;
              _local_1e8 = auVar121;
              ::anon_func::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_1a8,itime);
              auVar112._4_4_ = fStack_204;
              auVar112._0_4_ = local_208;
              auVar112._8_4_ = fStack_200;
              auVar112._12_4_ = fStack_1fc;
              auVar112 = vsubps_avx((undefined1  [16])local_98,auVar112);
              auVar17._4_4_ = fStack_174;
              auVar17._0_4_ = local_178;
              auVar17._8_4_ = fStack_170;
              auVar17._12_4_ = fStack_16c;
              auVar63 = vsubps_avx(local_88,auVar17);
              auVar51 = vminps_avx(auVar112,ZEXT816(0) << 0x40);
              auVar112 = vmaxps_avx(auVar63,ZEXT816(0) << 0x40);
              auVar156._0_4_ = auVar156._0_4_ + auVar51._0_4_;
              auVar156._4_4_ = fVar146 + auVar51._4_4_;
              auVar156._8_4_ = fVar151 + auVar51._8_4_;
              auVar156._12_4_ = fVar153 + auVar51._12_4_;
              auVar108._0_4_ = auVar108._0_4_ + auVar51._0_4_;
              auVar108._4_4_ = fVar50 + auVar51._4_4_;
              auVar108._8_4_ = fVar49 + auVar51._8_4_;
              auVar108._12_4_ = fVar62 + auVar51._12_4_;
              auVar129._0_4_ = auVar129._0_4_ + auVar112._0_4_;
              auVar129._4_4_ = fVar72 + auVar112._4_4_;
              auVar129._8_4_ = fVar73 + auVar112._8_4_;
              auVar129._12_4_ = fVar74 + auVar112._12_4_;
              auVar121._0_4_ = (float)local_1e8._0_4_ + auVar112._0_4_;
              auVar121._4_4_ = (float)local_1e8._4_4_ + auVar112._4_4_;
              auVar121._8_4_ = fStack_1e0 + auVar112._8_4_;
              auVar121._12_4_ = fStack_1dc + auVar112._12_4_;
              itime = itime + 1;
              iVar47 = iVar47 + -1;
            } while (iVar47 != 0);
          }
          auVar112 = ZEXT816(0) << 0x40;
        }
        auVar150 = ZEXT1664(auVar112);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar156,ZEXT416(geomID),0x30);
        uVar37 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.numTimeSteps - 1;
        uVar38 = (ulong)uVar37;
        BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar58._8_8_ = 0;
        auVar58._0_4_ = BVar3.lower;
        auVar58._4_4_ = BVar3.upper;
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar129,ZEXT416((uint)uVar41),0x30);
        aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar108,ZEXT416(uVar37),0x30);
        aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar121,ZEXT416(uVar37),0x30);
        auVar51 = vcmpps_avx(local_258,auVar58,1);
        auVar63 = vinsertps_avx(local_258,auVar58,0x50);
        auVar112 = vblendps_avx(auVar58,local_258,2);
        local_258 = vblendvps_avx(auVar112,auVar63,auVar51);
        auVar111._0_4_ = aVar10.x * 0.5 + aVar12.x * 0.5 + aVar11.x * 0.5 + aVar13.x * 0.5;
        auVar111._4_4_ = aVar10.y * 0.5 + aVar12.y * 0.5 + aVar11.y * 0.5 + aVar13.y * 0.5;
        auVar111._8_4_ = aVar10.z * 0.5 + aVar12.z * 0.5 + aVar11.z * 0.5 + aVar13.z * 0.5;
        auVar111._12_4_ =
             aVar10.field_3.w * 0.5 + aVar12.field_3.w * 0.5 +
             aVar11.field_3.w * 0.5 + aVar13.field_3.w * 0.5;
        local_278.m128 = (__m128)vminps_avx(local_278.m128,auVar111);
        local_288.m128 = (__m128)vmaxps_avx(local_288.m128,auVar111);
        local_2e0 = local_2e0 + 1;
        local_2d8 = local_2d8 + uVar38;
        auVar112 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar40 >> 8),local_320 < uVar38)),0x50)
        ;
        auVar112 = vpslld_avx(auVar112,0x1f);
        local_268 = vblendvps_avx(local_268,auVar58,auVar112);
        auVar112 = vminps_avx(auVar120,(undefined1  [16])aVar10);
        auVar124 = ZEXT1664(auVar112);
        if (local_320 <= uVar38) {
          local_320 = uVar38;
        }
        pPVar8 = prims->items;
        pPVar8[local_2d0].lbounds.bounds0.lower.field_0.field_1 = aVar10;
        auVar112 = vmaxps_avx(auVar107,(undefined1  [16])aVar11);
        auVar116 = ZEXT1664(auVar112);
        pPVar8[local_2d0].lbounds.bounds0.upper.field_0.field_1 = aVar11;
        local_2a8.m128 = (__m128)vminps_avx(local_2a8.m128,(undefined1  [16])aVar12);
        pPVar8[local_2d0].lbounds.bounds1.lower.field_0.field_1 = aVar12;
        local_298.m128 = (__m128)vmaxps_avx(local_298.m128,(undefined1  [16])aVar13);
        pPVar8[local_2d0].lbounds.bounds1.upper.field_0.field_1 = aVar13;
        pPVar8[local_2d0].time_range = BVar3;
        local_2d0 = local_2d0 + 1;
        auVar134 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
        auVar141 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
        auVar112 = _local_1e8;
        uVar36 = _local_1c8;
      }
LAB_012468b8:
      _local_1c8 = uVar36;
      _local_1e8 = auVar112;
      uVar41 = uVar41 + 1;
    } while (uVar41 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_2e0;
    aVar123 = auVar124._0_16_;
    aVar113 = auVar116._0_16_;
  }
  else {
    local_258 = SUB6416(ZEXT464(0x3f800000),0);
    local_268 = ZEXT816(0x3f80000000000000);
    local_278.m128[2] = INFINITY;
    local_278._0_8_ = 0x7f8000007f800000;
    local_278.m128[3] = INFINITY;
    local_288.m128[2] = -INFINITY;
    local_288._0_8_ = 0xff800000ff800000;
    local_288.m128[3] = -INFINITY;
    local_320 = 0;
    local_2d8 = 0;
    local_298 = local_288;
    local_2a8 = local_278;
    aVar123 = local_278;
    aVar113 = local_288;
  }
  auVar112 = vmovlhps_avx(local_268,local_258);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar123;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar113;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = local_2a8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = local_298;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_278;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_288;
  __return_storage_ptr__->num_time_segments = local_2d8;
  __return_storage_ptr__->max_num_time_segments = local_320;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar112._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar112._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar112._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar112._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }